

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

VRMatrix4 * __thiscall
MinVR::VRMatrix4::transpose(VRMatrix4 *__return_storage_ptr__,VRMatrix4 *this)

{
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_48 = this->m[0];
  local_38 = this->m[1];
  local_28 = this->m[2];
  local_18 = this->m[3];
  local_44 = this->m[4];
  local_34 = this->m[5];
  local_24 = this->m[6];
  local_14 = this->m[7];
  local_40 = this->m[8];
  local_30 = this->m[9];
  local_20 = this->m[10];
  local_10 = this->m[0xb];
  local_3c = this->m[0xc];
  local_2c = this->m[0xd];
  local_1c = this->m[0xe];
  local_c = this->m[0xf];
  VRMatrix4(__return_storage_ptr__,&local_48);
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::transpose() const {
    return VRMatrix4::fromRowMajorElements(m[0], m[1], m[2], m[3],
                                           m[4], m[5], m[6], m[7],
                                           m[8], m[9], m[10], m[11],
                                           m[12], m[13], m[14], m[15]);
}